

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O2

int jpc_ppt_getparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in)

{
  int iVar1;
  uchar *buf;
  size_t size;
  
  (ms->parms).siz.height = 0;
  if ((ms->len != 0) && (iVar1 = jpc_getuint8(in,(uint_fast8_t *)&(ms->parms).soc), iVar1 == 0)) {
    size = ms->len - 1;
    (ms->parms).sot.len = size;
    if (size == 0) {
      (ms->parms).siz.height = 0;
      return 0;
    }
    buf = (uchar *)jas_malloc(size);
    (ms->parms).ppm.data = buf;
    if ((buf != (uchar *)0x0) &&
       (iVar1 = jas_stream_read(in,buf,*(uint *)((long)&ms->parms + 8)),
       iVar1 == *(int *)((long)&ms->parms + 8))) {
      return 0;
    }
  }
  jpc_ppt_destroyparms(ms);
  return -1;
}

Assistant:

static int jpc_ppt_getparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *in)
{
	jpc_ppt_t *ppt = &ms->parms.ppt;

	/* Eliminate compiler warning about unused variables. */
	(void)cstate;

	ppt->data = 0;

	if (ms->len < 1) {
		goto error;
	}
	if (jpc_getuint8(in, &ppt->ind)) {
		goto error;
	}
	ppt->len = ms->len - 1;
	if (ppt->len > 0) {
		if (!(ppt->data = jas_malloc(ppt->len))) {
			goto error;
		}
		if (jas_stream_read(in, (char *) ppt->data, ppt->len) != JAS_CAST(int, ppt->len)) {
			goto error;
		}
	} else {
		ppt->data = 0;
	}
	return 0;

error:
	jpc_ppt_destroyparms(ms);
	return -1;
}